

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::anon_unknown_1::applyFilenamesAsTags(IConfig *config)

{
  char *pcVar1;
  bool bVar2;
  TestCaseInfo *tags_00;
  long lVar3;
  ulong uVar4;
  size_type lastDot;
  size_type lastSlash;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  TestCase *testCase;
  iterator __end2;
  iterator __begin2;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range2;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *tests;
  reference in_stack_ffffffffffffff38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  allocator *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  string local_68 [56];
  reference local_30;
  TestCase *local_28;
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_20;
  TestCaseInfo *testCaseInfo;
  
  tags_00 = (TestCaseInfo *)getAllTestCasesSorted((IConfig *)0x23d81c);
  testCaseInfo = tags_00;
  local_20._M_current =
       (TestCase *)
       clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                  in_stack_ffffffffffffff38);
  local_28 = (TestCase *)
             clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                       ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                        in_stack_ffffffffffffff38);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar2) break;
    local_30 = __gnu_cxx::
               __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&local_20);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    pcVar1 = (local_30->super_TestCaseInfo).lineInfo.file;
    this = (allocator *)&stack0xffffffffffffff97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar1,this);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
    lVar3 = std::__cxx11::string::find_last_of((char *)local_68,0x2ecd05);
    if (lVar3 != -1) {
      std::__cxx11::string::erase((ulong)local_68,0);
      in_stack_ffffffffffffff40 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::__cxx11::string::operator[]((ulong)local_68);
      *(undefined1 *)
       &(in_stack_ffffffffffffff40->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = 0x23;
    }
    uVar4 = std::__cxx11::string::find_last_of((char)local_68,0x2e);
    if (uVar4 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)local_68,uVar4);
    }
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff38 = local_30;
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    setTags(testCaseInfo,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)tags_00);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
    std::__cxx11::string::~string(local_68);
    clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
    __gnu_cxx::
    __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void applyFilenamesAsTags(Catch::IConfig const& config) {
            auto& tests = const_cast<std::vector<TestCase>&>(getAllTestCasesSorted(config));
            for (auto& testCase : tests) {
                auto tags = testCase.tags;

                std::string filename = testCase.lineInfo.file;
                auto lastSlash = filename.find_last_of("\\/");
                if (lastSlash != std::string::npos) {
                    filename.erase(0, lastSlash);
                    filename[0] = '#';
                }

                auto lastDot = filename.find_last_of('.');
                if (lastDot != std::string::npos) {
                    filename.erase(lastDot);
                }

                tags.push_back(std::move(filename));
                setTags(testCase, tags);
            }
        }